

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_involve::preprocess
          (method_involve *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  iterator *piVar1;
  char cVar2;
  value_type ptVar3;
  token_base *ptVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Elt_pointer pdVar7;
  _Elt_pointer ppsVar8;
  char *pcVar9;
  proxy *ppVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [11];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar27;
  method_involve *pmVar28;
  int iVar29;
  const_reference pptVar30;
  token_base **pptVar31;
  tree_node *ptVar32;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar33;
  shared_ptr<cs::name_space> *psVar34;
  undefined4 extraout_var_01;
  compile_error *this_00;
  uint uVar35;
  size_t sVar36;
  domain_type *domain;
  _Elt_pointer pptVar37;
  domain_type *__range3;
  value_type *it;
  slot_type *name;
  char *pcVar38;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  var ns;
  any local_68;
  undefined1 local_60 [32];
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_40;
  method_involve *local_38;
  
  sVar36 = 1;
  pptVar30 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar3 = *pptVar30;
  local_60._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar31 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
  ptVar4 = *pptVar31;
  if ((ptVar4 == (token_base *)0x0) ||
     (ptVar4->_vptr_token_base != (_func_int **)&PTR__token_value_0032a608)) {
    ptVar32 = (tree_node *)statement_base::operator_new((statement_base *)0x30,sVar36);
    iVar29 = tree_type<cs::token_base_*>::copy
                       ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    peVar5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    pdVar7 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar37 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar37 ==
        (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar37 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar4 = pptVar37[-1];
    (((context_t *)&ptVar32->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar5;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar32->right)->_M_pi = p_Var6;
    ptVar32->data = (token_base *)ptVar4->line_num;
    ptVar32->root = (tree_node *)&PTR__statement_involve_0032af90;
    *(undefined1 *)&ptVar32[1].root = 0;
    (((context_t *)&ptVar32[1].left)->
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)CONCAT44(extraout_var,iVar29);
    ppsVar8 = (this->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    local_60._0_8_ = ptVar32;
    if (ppsVar8 ==
        (this->mResult).
        super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
      _M_push_back_aux<cs::statement_involve*>
                ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
                 (statement_involve **)local_60);
    }
    else {
      *ppsVar8 = (statement_base *)ptVar32;
      piVar1 = &(this->mResult).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  }
  else {
    local_68.mDat = (proxy *)ptVar4[1]._vptr_token_base;
    if (local_68.mDat == (proxy *)0x0) {
      local_68.mDat = (proxy *)0x0;
      puVar33 = &void::typeinfo;
    }
    else {
      (local_68.mDat)->refcount = (local_68.mDat)->refcount + 1;
      iVar29 = (*(local_68.mDat)->data->_vptr_baseHolder[2])();
      puVar33 = (undefined *)CONCAT44(extraout_var_00,iVar29);
    }
    pcVar9 = *(char **)(puVar33 + 8);
    if ((pcVar9 != "St10shared_ptrIN2cs10name_spaceEE") &&
       ((*pcVar9 == '*' ||
        (iVar29 = strcmp(pcVar9,"St10shared_ptrIN2cs10name_spaceEE"), iVar29 != 0)))) {
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      local_60._0_8_ = local_60 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"Only support involve namespace.","");
      compile_error::compile_error(this_00,(string *)local_60);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_40 = raw;
    psVar34 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(&local_68);
    domain = ((psVar34->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_data;
    pcVar9 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    name = (domain->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .slots_;
    cVar2 = *pcVar9;
    pcVar38 = pcVar9;
    while (cVar2 < -1) {
      iVar29 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar16 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar17 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar18 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar38 < (char)iVar29);
      in_XMM1_Bb = -(pcVar38[1] < (char)((uint)iVar29 >> 8));
      in_XMM1_Bc = -(pcVar38[2] < (char)((uint)iVar29 >> 0x10));
      in_XMM1_Bd = -(pcVar38[3] < (char)((uint)iVar29 >> 0x18));
      in_XMM1_Be = -(pcVar38[4] < (char)iVar16);
      in_XMM1_Bf = -(pcVar38[5] < (char)((uint)iVar16 >> 8));
      in_XMM1_Bg = -(pcVar38[6] < (char)((uint)iVar16 >> 0x10));
      in_XMM1_Bh = -(pcVar38[7] < (char)((uint)iVar16 >> 0x18));
      in_XMM1_Bi = -(pcVar38[8] < (char)iVar17);
      in_XMM1_Bj = -(pcVar38[9] < (char)((uint)iVar17 >> 8));
      in_XMM1_Bk = -(pcVar38[10] < (char)((uint)iVar17 >> 0x10));
      in_XMM1_Bl = -(pcVar38[0xb] < (char)((uint)iVar17 >> 0x18));
      in_XMM1_Bm = -(pcVar38[0xc] < (char)iVar18);
      in_XMM1_Bn = -(pcVar38[0xd] < (char)((uint)iVar18 >> 8));
      in_XMM1_Bo = -(pcVar38[0xe] < (char)((uint)iVar18 >> 0x10));
      in_XMM1_Bp = -(pcVar38[0xf] < (char)((uint)iVar18 >> 0x18));
      auVar12[1] = in_XMM1_Bb;
      auVar12[0] = in_XMM1_Ba;
      auVar12[2] = in_XMM1_Bc;
      auVar12[3] = in_XMM1_Bd;
      auVar12[4] = in_XMM1_Be;
      auVar12[5] = in_XMM1_Bf;
      auVar12[6] = in_XMM1_Bg;
      auVar12[7] = in_XMM1_Bh;
      auVar12[8] = in_XMM1_Bi;
      auVar12[9] = in_XMM1_Bj;
      auVar12[10] = in_XMM1_Bk;
      auVar12[0xb] = in_XMM1_Bl;
      auVar12[0xc] = in_XMM1_Bm;
      auVar12[0xd] = in_XMM1_Bn;
      auVar12[0xe] = in_XMM1_Bo;
      auVar12[0xf] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bb;
      auVar13[0] = in_XMM1_Ba;
      auVar13[2] = in_XMM1_Bc;
      auVar13[3] = in_XMM1_Bd;
      auVar13[4] = in_XMM1_Be;
      auVar13[5] = in_XMM1_Bf;
      auVar13[6] = in_XMM1_Bg;
      auVar13[7] = in_XMM1_Bh;
      auVar13[8] = in_XMM1_Bi;
      auVar13[9] = in_XMM1_Bj;
      auVar13[10] = in_XMM1_Bk;
      auVar13[0xb] = in_XMM1_Bl;
      auVar13[0xc] = in_XMM1_Bm;
      auVar13[0xd] = in_XMM1_Bn;
      auVar13[0xe] = in_XMM1_Bo;
      auVar13[0xf] = in_XMM1_Bp;
      auVar25[1] = in_XMM1_Bd;
      auVar25[0] = in_XMM1_Bc;
      auVar25[2] = in_XMM1_Be;
      auVar25[3] = in_XMM1_Bf;
      auVar25[4] = in_XMM1_Bg;
      auVar25[5] = in_XMM1_Bh;
      auVar25[6] = in_XMM1_Bi;
      auVar25[7] = in_XMM1_Bj;
      auVar25[8] = in_XMM1_Bk;
      auVar25[9] = in_XMM1_Bl;
      auVar25[10] = in_XMM1_Bm;
      auVar25[0xb] = in_XMM1_Bn;
      auVar25[0xc] = in_XMM1_Bo;
      auVar25[0xd] = in_XMM1_Bp;
      auVar23[1] = in_XMM1_Be;
      auVar23[0] = in_XMM1_Bd;
      auVar23[2] = in_XMM1_Bf;
      auVar23[3] = in_XMM1_Bg;
      auVar23[4] = in_XMM1_Bh;
      auVar23[5] = in_XMM1_Bi;
      auVar23[6] = in_XMM1_Bj;
      auVar23[7] = in_XMM1_Bk;
      auVar23[8] = in_XMM1_Bl;
      auVar23[9] = in_XMM1_Bm;
      auVar23[10] = in_XMM1_Bn;
      auVar23[0xb] = in_XMM1_Bo;
      auVar23[0xc] = in_XMM1_Bp;
      auVar21[1] = in_XMM1_Bf;
      auVar21[0] = in_XMM1_Be;
      auVar21[2] = in_XMM1_Bg;
      auVar21[3] = in_XMM1_Bh;
      auVar21[4] = in_XMM1_Bi;
      auVar21[5] = in_XMM1_Bj;
      auVar21[6] = in_XMM1_Bk;
      auVar21[7] = in_XMM1_Bl;
      auVar21[8] = in_XMM1_Bm;
      auVar21[9] = in_XMM1_Bn;
      auVar21[10] = in_XMM1_Bo;
      auVar21[0xb] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Bg;
      auVar19[0] = in_XMM1_Bf;
      auVar19[2] = in_XMM1_Bh;
      auVar19[3] = in_XMM1_Bi;
      auVar19[4] = in_XMM1_Bj;
      auVar19[5] = in_XMM1_Bk;
      auVar19[6] = in_XMM1_Bl;
      auVar19[7] = in_XMM1_Bm;
      auVar19[8] = in_XMM1_Bn;
      auVar19[9] = in_XMM1_Bo;
      auVar19[10] = in_XMM1_Bp;
      uVar35 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar25 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar19 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar11 = 0;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      name = name + uVar11;
      cVar2 = pcVar38[uVar11];
      pcVar38 = pcVar38 + uVar11;
    }
    sVar36 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    local_38 = this;
    while (pcVar38 != pcVar9 + sVar36) {
      ppVar10 = (domain->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                _M_impl.super__Vector_impl_data._M_start[(name->value).second].mDat;
      if ((ppVar10 != (proxy *)0x0) && (0 < ppVar10->protect_level)) {
        domain_manager::add_record
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,&(name->value).first);
      }
      name = name + 1;
      cVar2 = pcVar38[1];
      pcVar38 = pcVar38 + 1;
      while (cVar2 < -1) {
        iVar29 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar16 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar17 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar18 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar38 < (char)iVar29);
        in_XMM1_Bb = -(pcVar38[1] < (char)((uint)iVar29 >> 8));
        in_XMM1_Bc = -(pcVar38[2] < (char)((uint)iVar29 >> 0x10));
        in_XMM1_Bd = -(pcVar38[3] < (char)((uint)iVar29 >> 0x18));
        in_XMM1_Be = -(pcVar38[4] < (char)iVar16);
        in_XMM1_Bf = -(pcVar38[5] < (char)((uint)iVar16 >> 8));
        in_XMM1_Bg = -(pcVar38[6] < (char)((uint)iVar16 >> 0x10));
        in_XMM1_Bh = -(pcVar38[7] < (char)((uint)iVar16 >> 0x18));
        in_XMM1_Bi = -(pcVar38[8] < (char)iVar17);
        in_XMM1_Bj = -(pcVar38[9] < (char)((uint)iVar17 >> 8));
        in_XMM1_Bk = -(pcVar38[10] < (char)((uint)iVar17 >> 0x10));
        in_XMM1_Bl = -(pcVar38[0xb] < (char)((uint)iVar17 >> 0x18));
        in_XMM1_Bm = -(pcVar38[0xc] < (char)iVar18);
        in_XMM1_Bn = -(pcVar38[0xd] < (char)((uint)iVar18 >> 8));
        in_XMM1_Bo = -(pcVar38[0xe] < (char)((uint)iVar18 >> 0x10));
        in_XMM1_Bp = -(pcVar38[0xf] < (char)((uint)iVar18 >> 0x18));
        auVar14[1] = in_XMM1_Bb;
        auVar14[0] = in_XMM1_Ba;
        auVar14[2] = in_XMM1_Bc;
        auVar14[3] = in_XMM1_Bd;
        auVar14[4] = in_XMM1_Be;
        auVar14[5] = in_XMM1_Bf;
        auVar14[6] = in_XMM1_Bg;
        auVar14[7] = in_XMM1_Bh;
        auVar14[8] = in_XMM1_Bi;
        auVar14[9] = in_XMM1_Bj;
        auVar14[10] = in_XMM1_Bk;
        auVar14[0xb] = in_XMM1_Bl;
        auVar14[0xc] = in_XMM1_Bm;
        auVar14[0xd] = in_XMM1_Bn;
        auVar14[0xe] = in_XMM1_Bo;
        auVar14[0xf] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Bb;
        auVar15[0] = in_XMM1_Ba;
        auVar15[2] = in_XMM1_Bc;
        auVar15[3] = in_XMM1_Bd;
        auVar15[4] = in_XMM1_Be;
        auVar15[5] = in_XMM1_Bf;
        auVar15[6] = in_XMM1_Bg;
        auVar15[7] = in_XMM1_Bh;
        auVar15[8] = in_XMM1_Bi;
        auVar15[9] = in_XMM1_Bj;
        auVar15[10] = in_XMM1_Bk;
        auVar15[0xb] = in_XMM1_Bl;
        auVar15[0xc] = in_XMM1_Bm;
        auVar15[0xd] = in_XMM1_Bn;
        auVar15[0xe] = in_XMM1_Bo;
        auVar15[0xf] = in_XMM1_Bp;
        auVar26[1] = in_XMM1_Bd;
        auVar26[0] = in_XMM1_Bc;
        auVar26[2] = in_XMM1_Be;
        auVar26[3] = in_XMM1_Bf;
        auVar26[4] = in_XMM1_Bg;
        auVar26[5] = in_XMM1_Bh;
        auVar26[6] = in_XMM1_Bi;
        auVar26[7] = in_XMM1_Bj;
        auVar26[8] = in_XMM1_Bk;
        auVar26[9] = in_XMM1_Bl;
        auVar26[10] = in_XMM1_Bm;
        auVar26[0xb] = in_XMM1_Bn;
        auVar26[0xc] = in_XMM1_Bo;
        auVar26[0xd] = in_XMM1_Bp;
        auVar24[1] = in_XMM1_Be;
        auVar24[0] = in_XMM1_Bd;
        auVar24[2] = in_XMM1_Bf;
        auVar24[3] = in_XMM1_Bg;
        auVar24[4] = in_XMM1_Bh;
        auVar24[5] = in_XMM1_Bi;
        auVar24[6] = in_XMM1_Bj;
        auVar24[7] = in_XMM1_Bk;
        auVar24[8] = in_XMM1_Bl;
        auVar24[9] = in_XMM1_Bm;
        auVar24[10] = in_XMM1_Bn;
        auVar24[0xb] = in_XMM1_Bo;
        auVar24[0xc] = in_XMM1_Bp;
        auVar22[1] = in_XMM1_Bf;
        auVar22[0] = in_XMM1_Be;
        auVar22[2] = in_XMM1_Bg;
        auVar22[3] = in_XMM1_Bh;
        auVar22[4] = in_XMM1_Bi;
        auVar22[5] = in_XMM1_Bj;
        auVar22[6] = in_XMM1_Bk;
        auVar22[7] = in_XMM1_Bl;
        auVar22[8] = in_XMM1_Bm;
        auVar22[9] = in_XMM1_Bn;
        auVar22[10] = in_XMM1_Bo;
        auVar22[0xb] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bg;
        auVar20[0] = in_XMM1_Bf;
        auVar20[2] = in_XMM1_Bh;
        auVar20[3] = in_XMM1_Bi;
        auVar20[4] = in_XMM1_Bj;
        auVar20[5] = in_XMM1_Bk;
        auVar20[6] = in_XMM1_Bl;
        auVar20[7] = in_XMM1_Bm;
        auVar20[8] = in_XMM1_Bn;
        auVar20[9] = in_XMM1_Bo;
        auVar20[10] = in_XMM1_Bp;
        uVar35 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar26 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar22 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar20 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar11 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        name = name + uVar11;
        cVar2 = pcVar38[uVar11];
        pcVar38 = pcVar38 + uVar11;
      }
    }
    domain_manager::involve_domain
              (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,domain,false);
    pmVar28 = local_38;
    ptVar32 = (tree_node *)statement_base::operator_new((statement_base *)0x30,(size_t)domain);
    pdVar27 = local_40;
    iVar29 = tree_type<cs::token_base_*>::copy
                       ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    peVar5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    pdVar7 = (pdVar27->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar37 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar37 ==
        (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar37 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar4 = pptVar37[-1];
    (((context_t *)&ptVar32->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar5;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar32->right)->_M_pi = p_Var6;
    ptVar32->data = (token_base *)ptVar4->line_num;
    ptVar32->root = (tree_node *)&PTR__statement_involve_0032af90;
    *(undefined1 *)&ptVar32[1].root = 1;
    (((context_t *)&ptVar32[1].left)->
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)CONCAT44(extraout_var_01,iVar29);
    ppsVar8 = (pmVar28->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    local_60._0_8_ = ptVar32;
    if (ppsVar8 ==
        (pmVar28->mResult).
        super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
      _M_push_back_aux<cs::statement_involve*>
                ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&pmVar28->mResult
                 ,(statement_involve **)local_60);
    }
    else {
      *ppsVar8 = (statement_base *)ptVar32;
      piVar1 = &(pmVar28->mResult).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
    cs_impl::any::recycle(&local_68);
  }
  return;
}

Assistant:

void method_involve::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_value *vptr = dynamic_cast<token_value *>(tree.root().data());
		if (vptr != nullptr) {
			var ns = vptr->get_value();
			if (ns.type() == typeid(namespace_t)) {
				auto &domain = ns.const_val<namespace_t>()->get_domain();
				for (auto &it: domain) {
					if (domain.get_var_by_id(it.second).is_protect())
						context->instance->storage.add_record(it.first);
				}
				context->instance->storage.involve_domain(domain);
			}
			else
				throw compile_error("Only support involve namespace.");
			mResult.emplace_back(new statement_involve(tree, true, context, raw.front().back()));
		}
		else
			mResult.emplace_back(new statement_involve(tree, false, context, raw.front().back()));
	}